

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::CartesianProductGenerator<const_libaom_test::CodecFactory_*,_int,_unsigned_int>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  bool bVar1;
  shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_> *this_00;
  uint *in_RDI;
  int *unaff_retaddr;
  CodecFactory **in_stack_00000008;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *in_stack_00000010;
  shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_>
  *in_stack_ffffffffffffffc8;
  
  bVar1 = AtEnd(in_stack_00000010);
  if (!bVar1) {
    std::
    get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                *)0x8cd52e);
    this_00 = (shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_> *)
              ParamIterator<const_libaom_test::CodecFactory_*>::operator*
                        ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x8cd536);
    std::
    get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                *)0x8cd549);
    ParamIterator<int>::operator*((ParamIterator<int> *)0x8cd551);
    std::
    get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
                *)0x8cd564);
    ParamIterator<unsigned_int>::operator*((ParamIterator<unsigned_int> *)0x8cd56c);
    std::
    make_shared<std::tuple<libaom_test::CodecFactory_const*,int,unsigned_int>,libaom_test::CodecFactory_const*const&,int_const&,unsigned_int_const&>
              (in_stack_00000008,unaff_retaddr,in_RDI);
    std::shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_>::operator=
              (this_00,in_stack_ffffffffffffffc8);
    std::shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_>::~shared_ptr
              ((shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_> *)
               0x8cd5a0);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }